

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

void IoTHubClientCore_LL_ReportedStateComplete(uint32_t item_id,int status_code,void *ctx)

{
  LOGGER_LOG p_Var1;
  PDLIST_ENTRY Entry;
  
  if (ctx == (void *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_ReportedStateComplete",0x24d,1,"Invalid argument handle=%p",0)
      ;
    }
  }
  else {
    Entry = (PDLIST_ENTRY)((long)ctx + 0x20);
    while (Entry = Entry->Flink, Entry != (PDLIST_ENTRY)((long)ctx + 0x20)) {
      if (*(uint32_t *)&Entry[-3].Blink == item_id) {
        if (Entry[-2].Blink != (DLIST_ENTRY_TAG *)0x0) {
          (*(code *)Entry[-2].Blink)(status_code,Entry[-1].Blink);
        }
        DList_RemoveEntryList(Entry);
        CONSTBUFFER_DecRef((CONSTBUFFER_HANDLE)Entry[-1].Flink);
        free(&Entry[-3].Blink);
        return;
      }
    }
  }
  return;
}

Assistant:

static void IoTHubClientCore_LL_ReportedStateComplete(uint32_t item_id, int status_code, void* ctx)
{
    if (ctx == NULL)
    {
        /*"shall return"*/
        LogError("Invalid argument handle=%p", ctx);
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)ctx;

        DLIST_ENTRY* client_item = handleData->iot_ack_queue.Flink;
        while (client_item != &(handleData->iot_ack_queue)) /*while we are not at the end of the list*/
        {
            PDLIST_ENTRY next_item = client_item->Flink;
            IOTHUB_DEVICE_TWIN* queue_data = containingRecord(client_item, IOTHUB_DEVICE_TWIN, entry);
            if (queue_data->item_id == item_id)
            {
                if (queue_data->reported_state_callback != NULL)
                {
                    queue_data->reported_state_callback(status_code, queue_data->context);
                }
                DList_RemoveEntryList(client_item);
                device_twin_data_destroy(queue_data);
                break;
            }
            client_item = next_item;
        }
    }
}